

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O0

bool visit<bool>(Visitor<bool> *visitor,Expression *expression)

{
  undefined1 local_30 [8];
  VoidVisitor void_visitor;
  Expression *expression_local;
  Visitor<bool> *visitor_local;
  
  void_visitor._16_8_ = expression;
  visit<bool>::VoidVisitor::VoidVisitor((VoidVisitor *)local_30,visitor);
  (**(code **)(*(long *)void_visitor._16_8_ + 0x10))(void_visitor._16_8_,local_30);
  return (bool)((byte)void_visitor.visitor & 1);
}

Assistant:

T visit(Visitor<T>& visitor, const Expression* expression) {
	class VoidVisitor: public Visitor<void> {
		Visitor<T>& visitor;
	public:
		T result;
		VoidVisitor(Visitor<T>& visitor): visitor(visitor) {}
		void visit_int_literal(const IntLiteral& int_literal) override {
			result = visitor.visit_int_literal(int_literal);
		}
		void visit_binary_expression(const BinaryExpression& binary_expression) override {
			result = visitor.visit_binary_expression(binary_expression);
		}
		void visit_array_literal(const ArrayLiteral& array_literal) override {
			result = visitor.visit_array_literal(array_literal);
		}
		void visit_string_literal(const StringLiteral& string_literal) override {
			result = visitor.visit_string_literal(string_literal);
		}
		void visit_if(const If& if_) override {
			result = visitor.visit_if(if_);
		}
		void visit_tuple_literal(const TupleLiteral& tuple_literal) override {
			result = visitor.visit_tuple_literal(tuple_literal);
		}
		void visit_tuple_access(const TupleAccess& tuple_access) override {
			result = visitor.visit_tuple_access(tuple_access);
		}
		void visit_struct_literal(const StructLiteral& struct_literal) override {
			result = visitor.visit_struct_literal(struct_literal);
		}
		void visit_struct_access(const StructAccess& struct_access) override {
			result = visitor.visit_struct_access(struct_access);
		}
		void visit_enum_literal(const EnumLiteral& enum_literal) override {
			result = visitor.visit_enum_literal(enum_literal);
		}
		void visit_switch(const Switch& switch_) override {
			result = visitor.visit_switch(switch_);
		}
		void visit_case_variable(const CaseVariable& case_variable) override {
			result = visitor.visit_case_variable(case_variable);
		}
		void visit_closure(const Closure& closure) override {
			result = visitor.visit_closure(closure);
		}
		void visit_closure_access(const ClosureAccess& closure_access) override {
			result = visitor.visit_closure_access(closure_access);
		}
		void visit_argument(const Argument& argument) override {
			result = visitor.visit_argument(argument);
		}
		void visit_closure_call(const ClosureCall& call) override {
			result = visitor.visit_closure_call(call);
		}
		void visit_method_call(const MethodCall& call) override {
			result = visitor.visit_method_call(call);
		}
		void visit_function_call(const FunctionCall& call) override {
			result = visitor.visit_function_call(call);
		}
		void visit_intrinsic(const Intrinsic& intrinsic) override {
			result = visitor.visit_intrinsic(intrinsic);
		}
		void visit_void_literal(const VoidLiteral& void_literal) override {
			result = visitor.visit_void_literal(void_literal);
		}
		void visit_bind(const Bind& bind) override {
			result = visitor.visit_bind(bind);
		}
		void visit_return(const Return& return_) override {
			result = visitor.visit_return(return_);
		}
		void visit_type_literal(const TypeLiteral& type_literal) override {
			result = visitor.visit_type_literal(type_literal);
		}
		void visit_struct_type_declaration(const StructTypeDeclaration& struct_type_declaration) override {
			result = visitor.visit_struct_type_declaration(struct_type_declaration);
		}
		void visit_struct_type_definition(const StructTypeDefinition& struct_type_definition) override {
			result = visitor.visit_struct_type_definition(struct_type_definition);
		}
		void visit_enum_type_declaration(const EnumTypeDeclaration& enum_type_declaration) override {
			result = visitor.visit_enum_type_declaration(enum_type_declaration);
		}
		void visit_enum_type_definition(const EnumTypeDefinition& enum_type_definition) override {
			result = visitor.visit_enum_type_definition(enum_type_definition);
		}
		void visit_type_assert(const TypeAssert& type_assert) override {
			result = visitor.visit_type_assert(type_assert);
		}
		void visit_return_type(const ReturnType& return_type) override {
			result = visitor.visit_return_type(return_type);
		}
	};
	VoidVisitor void_visitor(visitor);
	expression->accept(void_visitor);
	return void_visitor.result;
}